

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-list.c
# Opt level: O2

void test_qlist_empty(void)

{
  QLIST_NODE node;
  QLIST list;
  
  list.main.n = &list.main;
  list.tail = &list.main;
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x120,"%s","qlist_is_empty(&list)");
  node.n = &list.main;
  (list.tail)->n = &node;
  list.tail = &node;
  acutest_check_((uint)((QLIST *)list.main.n != &list),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x122,"%s","!qlist_is_empty(&list)");
  return;
}

Assistant:

static void
test_qlist_empty(void)
{
    QLIST list;
    QLIST_NODE node;

    qlist_init(&list);

    TEST_CHECK(qlist_is_empty(&list));
    qlist_append(&list, &node);
    TEST_CHECK(!qlist_is_empty(&list));
}